

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-alive.c
# Opt level: O0

int run_test_loop_alive(void)

{
  int iVar1;
  undefined8 uVar2;
  int r;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_alive(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-alive.c"
            ,0x2e,"!uv_loop_alive(uv_default_loop())");
    abort();
  }
  uVar2 = uv_default_loop();
  uv_timer_init(uVar2,&timer_handle);
  uv_timer_start(&timer_handle,timer_cb,100,0);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_alive(uVar2);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-alive.c"
            ,0x33,"uv_loop_alive(uv_default_loop())");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-alive.c"
            ,0x36,"r == 0");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_alive(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-alive.c"
            ,0x37,"!uv_loop_alive(uv_default_loop())");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_queue_work(uVar2,&work_req,work_cb,after_work_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-alive.c"
            ,0x3b,"r == 0");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_alive(uVar2);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-alive.c"
            ,0x3c,"uv_loop_alive(uv_default_loop())");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-alive.c"
            ,0x3f,"r == 0");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_alive(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-alive.c"
            ,0x40,"!uv_loop_alive(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(loop_alive) {
  int r;
  ASSERT(!uv_loop_alive(uv_default_loop()));

  /* loops with handles are alive */
  uv_timer_init(uv_default_loop(), &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 0);
  ASSERT(uv_loop_alive(uv_default_loop()));

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(!uv_loop_alive(uv_default_loop()));

  /* loops with requests are alive */
  r = uv_queue_work(uv_default_loop(), &work_req, work_cb, after_work_cb);
  ASSERT(r == 0);
  ASSERT(uv_loop_alive(uv_default_loop()));

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(!uv_loop_alive(uv_default_loop()));

  return 0;
}